

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int w2r_(int *ldr,int *ldw,int *l,int *m,double *r__,double *w)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int j;
  int i__;
  int i__2;
  int i__1;
  int w_offset;
  int w_dim1;
  int r_offset;
  int r_dim1;
  double *w_local;
  double *r___local;
  int *m_local;
  int *l_local;
  int *ldw_local;
  int *ldr_local;
  
  iVar1 = *ldr;
  iVar2 = *ldw;
  iVar3 = *m;
  for (j = 1; j <= iVar3; j = j + 1) {
    iVar4 = *l;
    for (i__ = 1; i__ <= iVar4; i__ = i__ + 1) {
      r__[(long)(i__ + j * iVar1) - (long)(iVar1 + 1)] =
           w[(long)(i__ + j * iVar2) - (long)(iVar2 + 1)];
    }
  }
  return 0;
}

Assistant:

int w2r_(int *ldr, int *ldw, int *l, int *m,
	fft_real_t *r__, fft_real_t *w)
{
    /* System generated locals */
    int r_dim1, r_offset, w_dim1, w_offset, i__1, i__2;

    /* Local variables */
     int i__, j;

    /* Parameter adjustments */
    r_dim1 = *ldr;
    r_offset = 1 + r_dim1;
    r__ -= r_offset;
    w_dim1 = *ldw;
    w_offset = 1 + w_dim1;
    w -= w_offset;

    /* Function Body */
    i__1 = *m;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *l;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    r__[i__ + j * r_dim1] = w[i__ + j * w_dim1];
	}
    }
    return 0;
}